

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O1

void __thiscall
Simplification_distributive_Test::~Simplification_distributive_Test
          (Simplification_distributive_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Simplification, distributive)
{
    auto const x = symbol("x");
    auto const n2 = 2_i;
    auto const n3 = 3_i;
    auto const e1 = x + n2 * x;
    auto const e2 = n3 * x;
    EXPECT_EQ(toString(e1), "(* 3 x)");
    EXPECT_EQ(toString(e2), "(* 3 x)");
    EXPECT_TRUE(mathiu::impl::equal(e1, e2));
}